

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void gen_compare_and_swap_pair(DisasContext_conflict1 *s,int rs,int rt,int rn,int size)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *pTVar1;
  uintptr_t o_5;
  TCGv_i64 arg2;
  TCGv_i64 arg2_00;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 *ppTVar4;
  TCGv_i64 addr;
  TCGTemp *pTVar5;
  TCGTemp *a2;
  TCGTemp *ts;
  TCGv_i64 ret;
  TCGTemp *ts_00;
  TCGv_i64 ret_00;
  TCGTemp *ts_01;
  TCGv_i64 ret_01;
  TCGv_i64 c2;
  TCGv_i32 pTVar6;
  uintptr_t o_4;
  code *func;
  uintptr_t o;
  TCGv_i64 pTVar7;
  uintptr_t o_3;
  ulong idx;
  uintptr_t o_1;
  TCGv_i64 val;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGv_i64 local_48;
  TCGv_i64 local_40;
  TCGv_i64 local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  arg2 = cpu_reg_aarch64(s,rs);
  arg2_00 = cpu_reg_aarch64(s,rs + 1);
  pTVar2 = cpu_reg_aarch64(s,rt);
  pTVar3 = cpu_reg_aarch64(s,rt + 1);
  idx = (ulong)(s->mmu_idx & 0xf);
  pTVar1 = s->uc->tcg_ctx;
  ppTVar4 = pTVar1->cpu_X + rn;
  if (rn == 0x1f) {
    ppTVar4 = pTVar1->cpu_X + 0x1f;
  }
  addr = clean_data_tbi(s,*ppTVar4);
  if (size == 2) {
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    val = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    pTVar7 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
    if (s->be_data == MO_8) {
      tcg_gen_deposit_i64_aarch64(tcg_ctx,pTVar7,pTVar2,pTVar3,0x20,0x20);
      pTVar2 = arg2_00;
      pTVar3 = arg2;
    }
    else {
      tcg_gen_deposit_i64_aarch64(tcg_ctx,pTVar7,pTVar3,pTVar2,0x20,0x20);
      pTVar2 = arg2;
      pTVar3 = arg2_00;
    }
    tcg_gen_deposit_i64_aarch64(tcg_ctx,val,pTVar3,pTVar2,0x20,0x20);
    tcg_gen_atomic_cmpxchg_i64_aarch64
              (tcg_ctx,val,addr,val,pTVar7,idx,s->be_data | (MO_ALIGN|MO_64));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
    pTVar2 = arg2_00;
    if (s->be_data != MO_8) {
      pTVar2 = arg2;
      arg2 = arg2_00;
    }
    tcg_gen_extr32_i64_aarch64(tcg_ctx,arg2,pTVar2,val);
  }
  else {
    if ((((s->base).tb)->cflags & 0x80000) != 0) {
      pTVar6 = tcg_const_i32_aarch64(tcg_ctx,rs);
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_48 = addr + (long)tcg_ctx;
      local_40 = pTVar2 + (long)tcg_ctx;
      if (s->be_data == MO_8) {
        func = helper_casp_le_parallel_aarch64;
      }
      else {
        func = helper_casp_be_parallel_aarch64;
      }
      local_38 = pTVar3 + (long)tcg_ctx;
      local_50 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)0x0,5,&local_58);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
      return;
    }
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    pTVar7 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
    a2 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    val = (TCGv_i64)((long)a2 - (long)tcg_ctx);
    ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)ts - (long)tcg_ctx);
    ts_00 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)ts_00 - (long)tcg_ctx);
    ts_01 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    ret_01 = (TCGv_i64)((long)ts_01 - (long)tcg_ctx);
    c2 = tcg_const_i64_aarch64(tcg_ctx,0);
    tcg_gen_qemu_ld_i64_aarch64(tcg_ctx,pTVar7,addr,idx,s->be_data | (MO_ALIGN_16|MO_64));
    tcg_gen_addi_i64_aarch64(tcg_ctx,ret,addr,8);
    tcg_gen_qemu_ld_i64_aarch64(tcg_ctx,val,ret,idx,s->be_data | MO_64);
    tcg_gen_setcond_i64_aarch64(tcg_ctx,TCG_COND_EQ,ret_00,pTVar7,arg2);
    tcg_gen_setcond_i64_aarch64(tcg_ctx,TCG_COND_EQ,ret_01,val,arg2_00);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_and_i64,(TCGArg)ts_01,(TCGArg)ts_01,(TCGArg)ts_00);
    tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_NE,ret_00,ret_01,c2,pTVar2,pTVar7);
    tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_NE,ret_01,ret_01,c2,pTVar3,val);
    tcg_gen_qemu_st_i64_aarch64(tcg_ctx,ret_00,addr,idx,s->be_data | MO_64);
    tcg_gen_qemu_st_i64_aarch64(tcg_ctx,ret_01,ret,idx,s->be_data | MO_64);
    tcg_temp_free_internal_aarch64(tcg_ctx,ts);
    tcg_temp_free_internal_aarch64(tcg_ctx,ts_00);
    tcg_temp_free_internal_aarch64(tcg_ctx,ts_01);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
    if (arg2 != pTVar7) {
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(arg2 + (long)tcg_ctx),(TCGArg)pTVar5);
    }
    if (arg2_00 != val) {
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(arg2_00 + (long)tcg_ctx),(TCGArg)a2);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_compare_and_swap_pair(DisasContext *s, int rs, int rt,
                                      int rn, int size)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 s1 = cpu_reg(s, rs);
    TCGv_i64 s2 = cpu_reg(s, rs + 1);
    TCGv_i64 t1 = cpu_reg(s, rt);
    TCGv_i64 t2 = cpu_reg(s, rt + 1);
    TCGv_i64 clean_addr;
    int memidx = get_mem_index(s);

    if (rn == 31) {
        gen_check_sp_alignment(s);
    }
    clean_addr = clean_data_tbi(s, cpu_reg_sp(s, rn));

    if (size == 2) {
        TCGv_i64 cmp = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);

        if (s->be_data == MO_LE) {
            tcg_gen_concat32_i64(tcg_ctx, val, t1, t2);
            tcg_gen_concat32_i64(tcg_ctx, cmp, s1, s2);
        } else {
            tcg_gen_concat32_i64(tcg_ctx, val, t2, t1);
            tcg_gen_concat32_i64(tcg_ctx, cmp, s2, s1);
        }

        tcg_gen_atomic_cmpxchg_i64(tcg_ctx, cmp, clean_addr, cmp, val, memidx,
                                   MO_64 | MO_ALIGN | s->be_data);
        tcg_temp_free_i64(tcg_ctx, val);

        if (s->be_data == MO_LE) {
            tcg_gen_extr32_i64(tcg_ctx, s1, s2, cmp);
        } else {
            tcg_gen_extr32_i64(tcg_ctx, s2, s1, cmp);
        }
        tcg_temp_free_i64(tcg_ctx, cmp);
    } else if (tb_cflags(s->base.tb) & CF_PARALLEL) {
        if (HAVE_CMPXCHG128) {
            TCGv_i32 tcg_rs = tcg_const_i32(tcg_ctx, rs);
            if (s->be_data == MO_LE) {
                gen_helper_casp_le_parallel(tcg_ctx, tcg_ctx->cpu_env, tcg_rs,
                                            clean_addr, t1, t2);
            } else {
                gen_helper_casp_be_parallel(tcg_ctx, tcg_ctx->cpu_env, tcg_rs,
                                            clean_addr, t1, t2);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_rs);
        } else {
            gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
            s->base.is_jmp = DISAS_NORETURN;
        }
    } else {
        TCGv_i64 d1 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 d2 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 a2 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 c1 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 c2 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 zero = tcg_const_i64(tcg_ctx, 0);

        /* Load the two words, in memory order.  */
        tcg_gen_qemu_ld_i64(tcg_ctx, d1, clean_addr, memidx,
                            MO_64 | MO_ALIGN_16 | s->be_data);
        tcg_gen_addi_i64(tcg_ctx, a2, clean_addr, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, d2, a2, memidx, MO_64 | s->be_data);

        /* Compare the two words, also in memory order.  */
        tcg_gen_setcond_i64(tcg_ctx, TCG_COND_EQ, c1, d1, s1);
        tcg_gen_setcond_i64(tcg_ctx, TCG_COND_EQ, c2, d2, s2);
        tcg_gen_and_i64(tcg_ctx, c2, c2, c1);

        /* If compare equal, write back new data, else write back old data.  */
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, c1, c2, zero, t1, d1);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, c2, c2, zero, t2, d2);
        tcg_gen_qemu_st_i64(tcg_ctx, c1, clean_addr, memidx, MO_64 | s->be_data);
        tcg_gen_qemu_st_i64(tcg_ctx, c2, a2, memidx, MO_64 | s->be_data);
        tcg_temp_free_i64(tcg_ctx, a2);
        tcg_temp_free_i64(tcg_ctx, c1);
        tcg_temp_free_i64(tcg_ctx, c2);
        tcg_temp_free_i64(tcg_ctx, zero);

        /* Write back the data from memory to Rs.  */
        tcg_gen_mov_i64(tcg_ctx, s1, d1);
        tcg_gen_mov_i64(tcg_ctx, s2, d2);
        tcg_temp_free_i64(tcg_ctx, d1);
        tcg_temp_free_i64(tcg_ctx, d2);
    }
}